

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  byte *pbVar1;
  IRIns *pIVar2;
  ushort uVar3;
  uint uVar4;
  CTypeID id;
  jit_State *J_00;
  SnapEntry *pSVar5;
  lua_State *plVar6;
  IRIns *pIVar7;
  CTState *cts;
  IRIns *pIVar8;
  IRIns *pIVar9;
  CTInfo info;
  uint uVar10;
  undefined4 uVar11;
  IRIns *pIVar12;
  GCcdata *pGVar13;
  byte bVar14;
  ulong uVar15;
  IRIns *pIVar16;
  uint8_t *puVar17;
  uint uVar18;
  IRIns *pIVar19;
  BloomFilter rfilt;
  TValue *pTVar20;
  ExitState *ex;
  uint ref;
  IRRef2 IVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  CTSize sz;
  TValue *in_stack_ffffffffffffff48;
  CTSize in_stack_ffffffffffffff50;
  CTSize local_74;
  TValue *local_70;
  long local_68;
  GCtab *local_60;
  TValue local_58;
  SnapShot *local_50;
  lua_State *local_48;
  BCIns *local_40;
  IRIns *local_38;
  
  uVar4 = J->exitno;
  ex = (ExitState *)(ulong)uVar4;
  J_00 = (jit_State *)J->trace[J->parent].gcptr64;
  local_68 = (long)ex * 3;
  local_50 = (J_00->cur).snap + (long)ex;
  uVar22 = (ulong)local_50->nent;
  uVar18 = local_50->mapofs;
  pIVar12 = (J_00->cur).ir;
  uVar23 = (ulong)((J_00->cur).nins - 1);
  pSVar5 = (J_00->cur).snapmap;
  if (*(char *)((long)pIVar12 + uVar23 * 8 + 5) == '\x14') {
    pIVar12 = pIVar12 + uVar23;
    rfilt = 0;
    do {
      if ((pIVar12->field_0).op2 <= uVar4) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar12 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar12 + -3);
      pIVar12 = pIVar12 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  local_40 = (BCIns *)(*(ulong *)(pSVar5 + uVar18 + uVar22) >> 8);
  plVar6 = J->L;
  *(BCIns **)(((ulong)plVar6->cframe & 0xfffffffffffffffc) + 0x18) = local_40 + 1;
  if ((TValue *)(plVar6->maxstack).ptr64 <= plVar6->base + local_50->topslot) {
    lj_snap_restore_cold_1();
  }
  local_70 = plVar6->base + -2;
  local_48 = plVar6;
  if (uVar22 != 0) {
    uVar23 = 0;
    do {
      uVar10 = pSVar5[uVar18 + uVar23];
      pIVar12 = local_38;
      if ((uVar10 >> 0x12 & 1) == 0) {
        pTVar20 = local_70 + (uVar10 >> 0x18);
        ref = uVar10 & 0xffff;
        pIVar7 = (J_00->cur).ir;
        if (*(char *)((long)pIVar7 + (ulong)ref * 8 + 6) == -3) {
          if (uVar23 != 0) {
            uVar15 = 0;
            do {
              if ((pSVar5[uVar18 + uVar15] & 0xffff) == ref) {
                *pTVar20 = local_70[pSVar5[uVar18 + uVar15] >> 0x18];
                goto LAB_0012d9ca;
              }
              uVar15 = uVar15 + 1;
            } while (uVar23 != uVar15);
          }
          pIVar2 = pIVar7 + ref;
          if ((pIVar2->field_1).o - 0x53 < 2) {
            cts = *(CTState **)((J->L->glref).ptr64 + 0x180);
            cts->L = J->L;
            id = pIVar7[(pIVar2->field_0).op1].field_1.op12;
            info = lj_ctype_info(cts,id,&local_74);
            pGVar13 = lj_cdata_newx(cts,id,local_74,info);
            pTVar20->u64 = (ulong)pGVar13 | 0xfffa800000000000;
            if ((pIVar2->field_1).o == 'T') {
              in_stack_ffffffffffffff48 =
                   (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),local_74);
              snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,(ulong)(pIVar2->field_0).op2,
                               (int)pGVar13 + 0x10,in_stack_ffffffffffffff48,
                               in_stack_ffffffffffffff50);
              pIVar12 = local_38;
            }
            else {
              uVar3 = (&((J_00->cur).snap)->ref)[local_68 * 2];
              pIVar7 = (J_00->cur).ir;
              pIVar19 = pIVar2;
joined_r0x0012d70c:
              pIVar19 = pIVar19 + 1;
              pIVar12 = local_38;
              if (pIVar19 < pIVar7 + uVar3) {
                if ((pIVar19->field_1).r == 0xfe) {
                  if ((ulong)(pIVar19->field_1).s == 0xff) {
                    uVar10 = (pIVar19->field_1).o - 0x4a;
                    if ((4 < uVar10) || (uVar10 == 2)) goto joined_r0x0012d70c;
                    pIVar8 = (J_00->cur).ir;
                    pIVar12 = pIVar8 + (pIVar19->field_0).op1;
                    if (((pIVar12->field_1).o & 0xfe) == 0x38) {
                      pIVar12 = pIVar8 + (pIVar12->field_0).op1;
                    }
                    bVar24 = pIVar8 + (pIVar12->field_0).op1 == pIVar2;
                  }
                  else {
                    bVar24 = pIVar19 == pIVar2 + (pIVar19->field_1).s;
                  }
                  if (bVar24) {
                    uVar10._0_2_ = *(IROpT *)((long)pIVar19 + 4);
                    uVar10._2_2_ = *(IRRef1 *)((long)pIVar19 + 6);
                    uVar11 = 8;
                    if ((0x605fd9U >> (uVar10 & 0x1f) & 1) == 0) {
                      bVar14 = ((byte)(undefined2)uVar10 & 0x1f) - 0xf;
                      uVar11 = 4;
                      if (bVar14 < 4) {
                        uVar11 = *(undefined4 *)(&DAT_00164014 + (ulong)bVar14 * 4);
                      }
                    }
                    pIVar12 = (J_00->cur).ir;
                    uVar15 = (ulong)*(ushort *)
                                     ((long)pIVar12 + (ulong)(pIVar19->field_0).op1 * 8 + 2);
                    if (*(char *)((long)pIVar12 + uVar15 * 8 + 5) == '\x1d') {
                      IVar21 = pIVar12[uVar15 + 1].i;
                    }
                    else {
                      IVar21 = pIVar12[uVar15].field_1.op12;
                    }
                    in_stack_ffffffffffffff48 =
                         (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),uVar11);
                    snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                     (ulong)(pIVar19->field_0).op2,IVar21 + (int)pGVar13,
                                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
                  }
                }
                goto joined_r0x0012d70c;
              }
            }
          }
          else {
            if ((pIVar2->field_1).o == 0x51) {
              local_60 = lj_tab_new(J->L,(uint)(pIVar2->field_0).op1,(uint)(pIVar2->field_0).op2);
            }
            else {
              local_60 = lj_tab_dup(J->L,(GCtab *)pIVar7[(ulong)(pIVar2->field_0).op1 + 1]);
            }
            pTVar20->u64 = (ulong)local_60 | 0xfffa000000000000;
            uVar3 = (&((J_00->cur).snap)->ref)[local_68 * 2];
            pIVar7 = (J_00->cur).ir;
            pIVar19 = pIVar2;
            pIVar8 = pIVar2;
            pIVar12 = local_38;
joined_r0x0012d86e:
            local_38 = pIVar8;
            pIVar2 = pIVar2 + 1;
            if (pIVar2 < pIVar7 + uVar3) {
              pIVar8 = local_38;
              pIVar12 = local_38;
              if ((pIVar2->field_1).r == 0xfe) {
                if ((ulong)(pIVar2->field_1).s == 0xff) {
                  uVar10 = (pIVar2->field_1).o - 0x4a;
                  if ((4 < uVar10) || (uVar10 == 2)) goto joined_r0x0012d86e;
                  pIVar9 = (J_00->cur).ir;
                  pIVar16 = pIVar9 + (pIVar2->field_0).op1;
                  if (((pIVar16->field_1).o & 0xfe) == 0x38) {
                    pIVar16 = pIVar9 + (pIVar16->field_0).op1;
                  }
                  bVar24 = pIVar9 + (pIVar16->field_0).op1 == pIVar19;
                }
                else {
                  bVar24 = pIVar2 == pIVar19 + (pIVar2->field_1).s;
                }
                if (bVar24) {
                  pIVar12 = (J_00->cur).ir;
                  if (*(char *)((long)pIVar12 + (ulong)(pIVar2->field_0).op1 * 8 + 5) == '>') {
                    in_stack_ffffffffffffff48 = &local_58;
                    snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar4,rfilt,
                                    (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff48);
                    (local_60->metatable).gcptr64 = local_58.u64 & 0x7fffffffffff;
                    pIVar8 = local_38;
                    pIVar12 = local_38;
                  }
                  else {
                    pIVar19 = pIVar12 + *(ushort *)
                                         ((long)pIVar12 + (ulong)(pIVar2->field_0).op1 * 8 + 2);
                    if ((pIVar19->field_1).o == '\x1e') {
                      pIVar19 = pIVar12 + (pIVar19->field_0).op1;
                    }
                    lj_ir_kvalue(J->L,&local_58,pIVar19);
                    in_stack_ffffffffffffff48 = lj_tab_set(J->L,local_60,&local_58);
                    snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar4,rfilt,
                                    (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff48);
                    pIVar19 = local_38;
                    pIVar8 = local_38;
                    pIVar12 = local_38;
                  }
                }
              }
              goto joined_r0x0012d86e;
            }
          }
        }
        else {
          in_stack_ffffffffffffff48 = pTVar20;
          snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar4,rfilt,ref,pTVar20);
          pIVar12 = local_38;
          if ((uVar10 >> 0x14 & 1) != 0) {
            (pTVar20->field_4).i = (int)pTVar20->n;
            (pTVar20->field_4).it = 0xfffe7fff;
          }
        }
      }
LAB_0012d9ca:
      local_38 = pIVar12;
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar22);
  }
  pTVar20 = local_48->base + (byte)pSVar5[uVar18 + uVar22];
  local_48->base = pTVar20;
  uVar18 = (byte)*local_40 - 0x3f;
  uVar4 = uVar18 >> 1;
  if ((((uVar4 | (uint)((uVar18 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar4 & 0x1f) & 1) != 0)) ||
     (0x58 < (byte)*local_40)) {
    puVar17 = &local_50->nslots;
  }
  else {
    puVar17 = (uint8_t *)(*(long *)((pTVar20[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
    local_70 = pTVar20;
  }
  local_48->top = local_70 + *puVar17;
  return local_40;
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      } else if ((sn & SNAP_KEYINDEX)) {
	/* A IRT_INT key index slot is restored as a number. Undo this. */
	o->u32.lo = (uint32_t)(LJ_DUALNUM ? intV(o) : lj_num2int(numV(o)));
	o->u32.hi = LJ_KEYINDEX;
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  return pc;
}